

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack16.h
# Opt level: O3

void ncnn::convdw3x3s2_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [64];
  undefined1 (*pauVar2) [64];
  undefined1 (*pauVar3) [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  int iVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  long lVar17;
  undefined1 (*pauVar18) [64];
  int iVar19;
  uint uVar20;
  long lVar21;
  undefined1 (*pauVar22) [64];
  int iVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  undefined1 (*pauVar28) [64];
  undefined1 (*pauVar29) [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  
  iVar13 = bottom_blob->c;
  if (0 < (long)iVar13) {
    uVar14 = top_blob->w;
    iVar15 = top_blob->h;
    lVar25 = (long)(int)((bottom_blob->w - uVar14) * 0x20);
    lVar24 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar34 = *(undefined1 (*) [64])(&_bias->data + lVar24 * 8);
      }
      if (0 < iVar15) {
        pauVar28 = (undefined1 (*) [64])
                   (top_blob->cstep * lVar24 * top_blob->elemsize + (long)top_blob->data);
        lVar17 = kernel->w * lVar24 * kernel->elemsize;
        pvVar16 = kernel->data;
        auVar4 = *(undefined1 (*) [64])((long)pvVar16 + lVar17);
        auVar5 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x40);
        auVar6 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x80);
        auVar7 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0xc0);
        auVar8 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x100);
        auVar9 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x140);
        auVar10 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x180);
        auVar11 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x1c0);
        auVar12 = *(undefined1 (*) [64])((long)pvVar16 + lVar17 + 0x200);
        pauVar29 = (undefined1 (*) [64])
                   (bottom_blob->cstep * lVar24 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar17 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar22 = (undefined1 (*) [64])(*pauVar29 + lVar17 * 2);
        pauVar18 = (undefined1 (*) [64])(*pauVar29 + lVar17);
        iVar23 = 0;
        do {
          if ((int)uVar14 < 4) {
            uVar26 = 0;
          }
          else {
            iVar19 = 3;
            do {
              auVar30 = vfmadd213ps_avx512f(*pauVar29,auVar4,auVar34);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar5,pauVar29[1]);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar6,pauVar29[2]);
              auVar31 = vfmadd213ps_avx512f(pauVar29[2],auVar4,auVar34);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar5,pauVar29[3]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar6,pauVar29[4]);
              auVar32 = vfmadd213ps_avx512f(pauVar29[4],auVar4,auVar34);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar5,pauVar29[5]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar6,pauVar29[6]);
              auVar33 = vfmadd213ps_avx512f(pauVar29[6],auVar4,auVar34);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar5,pauVar29[7]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar6,pauVar29[8]);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar7,*pauVar18);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar7,pauVar18[2]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar7,pauVar18[4]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar7,pauVar18[6]);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar8,pauVar18[1]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar8,pauVar18[3]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar8,pauVar18[5]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar8,pauVar18[7]);
              pauVar29 = pauVar29 + 8;
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar9,pauVar18[2]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar9,pauVar18[4]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar9,pauVar18[6]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar9,pauVar18[8]);
              pauVar1 = pauVar22 + 2;
              pauVar2 = pauVar22 + 4;
              pauVar3 = pauVar22 + 6;
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar10,*pauVar22);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar10,*pauVar1);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar10,*pauVar2);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar10,*pauVar3);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar11,pauVar22[1]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar11,pauVar22[3]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar11,pauVar22[5]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar11,pauVar22[7]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar12,pauVar22[8]);
              pauVar18 = pauVar18 + 8;
              pauVar22 = pauVar22 + 8;
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar12,*pauVar1);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar12,*pauVar2);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar12,*pauVar3);
              *pauVar28 = auVar30;
              pauVar28[1] = auVar31;
              pauVar28[2] = auVar32;
              pauVar28[3] = auVar33;
              pauVar28 = pauVar28 + 4;
              iVar19 = iVar19 + 4;
              uVar26 = uVar14 & 0xfffffffc;
            } while (iVar19 < (int)uVar14);
          }
          uVar20 = uVar26 | 1;
          while ((int)uVar20 < (int)uVar14) {
            auVar30 = vfmadd213ps_avx512f(*pauVar29,auVar4,auVar34);
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar5,pauVar29[1]);
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar6,pauVar29[2]);
            auVar31 = vfmadd213ps_avx512f(pauVar29[2],auVar4,auVar34);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar5,pauVar29[3]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar6,pauVar29[4]);
            pauVar29 = pauVar29 + 4;
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar7,*pauVar18);
            pauVar1 = pauVar18 + 2;
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar7,*pauVar1);
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar8,pauVar18[1]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar8,pauVar18[3]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar9,pauVar18[4]);
            pauVar18 = pauVar18 + 4;
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar9,*pauVar1);
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar10,*pauVar22);
            pauVar1 = pauVar22 + 2;
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar10,*pauVar1);
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar11,pauVar22[1]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar11,pauVar22[3]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar12,pauVar22[4]);
            pauVar22 = pauVar22 + 4;
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar12,*pauVar1);
            *pauVar28 = auVar30;
            pauVar28[1] = auVar31;
            pauVar28 = pauVar28 + 2;
            uVar20 = uVar26 + 3;
            uVar26 = uVar26 + 2;
          }
          iVar19 = uVar14 - uVar26;
          if (iVar19 != 0 && (int)uVar26 <= (int)uVar14) {
            lVar21 = 0;
            lVar17 = 0;
            do {
              lVar27 = lVar17;
              auVar30 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(*pauVar29 + lVar27 * 2),auVar4,
                                            auVar34);
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar5,
                                            *(undefined1 (*) [64])(pauVar29[1] + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar6,
                                            *(undefined1 (*) [64])(pauVar29[2] + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar7,
                                            *(undefined1 (*) [64])(*pauVar18 + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar8,
                                            *(undefined1 (*) [64])(pauVar18[1] + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar9,
                                            *(undefined1 (*) [64])(pauVar18[2] + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar10,
                                            *(undefined1 (*) [64])(*pauVar22 + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar11,
                                            *(undefined1 (*) [64])(pauVar22[1] + lVar27 * 2));
              auVar30 = vfmadd231ps_avx512f(auVar30,auVar12,
                                            *(undefined1 (*) [64])(pauVar22[2] + lVar27 * 2));
              *(undefined1 (*) [64])((long)*pauVar28 + lVar27) = auVar30;
              lVar21 = lVar21 + -0x80;
              iVar19 = iVar19 + -1;
              lVar17 = lVar27 + 0x40;
            } while (iVar19 != 0);
            pauVar28 = (undefined1 (*) [64])(pauVar28[1] + lVar27);
            pauVar29 = (undefined1 (*) [64])((long)pauVar29 - lVar21);
            pauVar18 = (undefined1 (*) [64])((long)pauVar18 - lVar21);
            pauVar22 = (undefined1 (*) [64])((long)pauVar22 - lVar21);
          }
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + lVar25 * 4);
          pauVar18 = (undefined1 (*) [64])(*pauVar18 + lVar25 * 4);
          pauVar22 = (undefined1 (*) [64])(*pauVar22 + lVar25 * 4);
          iVar23 = iVar23 + 1;
        } while (iVar23 != iVar15);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar13);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 16;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m512 _bias0 = bias ? _mm512_loadu_ps((const float*)bias + g * 16) : _mm512_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m512 _k00 = _mm512_load_ps(k0);
        __m512 _k01 = _mm512_load_ps(k0 + 16);
        __m512 _k02 = _mm512_load_ps(k0 + 32);
        __m512 _k10 = _mm512_load_ps(k0 + 48);
        __m512 _k11 = _mm512_load_ps(k0 + 64);
        __m512 _k12 = _mm512_load_ps(k0 + 80);
        __m512 _k20 = _mm512_load_ps(k0 + 96);
        __m512 _k21 = _mm512_load_ps(k0 + 112);
        __m512 _k22 = _mm512_load_ps(k0 + 128);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;
                __m512 _sum2 = _bias0;
                __m512 _sum3 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);
                __m512 _r05 = _mm512_load_ps(r0 + 80);
                __m512 _r06 = _mm512_load_ps(r0 + 96);
                __m512 _r07 = _mm512_load_ps(r0 + 112);
                __m512 _r08 = _mm512_load_ps(r0 + 128);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum2 = _mm512_fmadd_ps(_k00, _r04, _sum2);
                _sum3 = _mm512_fmadd_ps(_k00, _r06, _sum3);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum2 = _mm512_fmadd_ps(_k01, _r05, _sum2);
                _sum3 = _mm512_fmadd_ps(_k01, _r07, _sum3);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);
                _sum2 = _mm512_fmadd_ps(_k02, _r06, _sum2);
                _sum3 = _mm512_fmadd_ps(_k02, _r08, _sum3);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);
                __m512 _r15 = _mm512_load_ps(r1 + 80);
                __m512 _r16 = _mm512_load_ps(r1 + 96);
                __m512 _r17 = _mm512_load_ps(r1 + 112);
                __m512 _r18 = _mm512_load_ps(r1 + 128);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum2 = _mm512_fmadd_ps(_k10, _r14, _sum2);
                _sum3 = _mm512_fmadd_ps(_k10, _r16, _sum3);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum2 = _mm512_fmadd_ps(_k11, _r15, _sum2);
                _sum3 = _mm512_fmadd_ps(_k11, _r17, _sum3);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);
                _sum2 = _mm512_fmadd_ps(_k12, _r16, _sum2);
                _sum3 = _mm512_fmadd_ps(_k12, _r18, _sum3);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);
                __m512 _r25 = _mm512_load_ps(r2 + 80);
                __m512 _r26 = _mm512_load_ps(r2 + 96);
                __m512 _r27 = _mm512_load_ps(r2 + 112);
                __m512 _r28 = _mm512_load_ps(r2 + 128);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum2 = _mm512_fmadd_ps(_k20, _r24, _sum2);
                _sum3 = _mm512_fmadd_ps(_k20, _r26, _sum3);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum2 = _mm512_fmadd_ps(_k21, _r25, _sum2);
                _sum3 = _mm512_fmadd_ps(_k21, _r27, _sum3);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);
                _sum2 = _mm512_fmadd_ps(_k22, _r26, _sum2);
                _sum3 = _mm512_fmadd_ps(_k22, _r28, _sum3);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);
                _mm512_store_ps(outptr0 + 32, _sum2);
                _mm512_store_ps(outptr0 + 48, _sum3);

                r0 += 2 * 64;
                r1 += 2 * 64;
                r2 += 2 * 64;
                outptr0 += 64;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j < outw; j++)
            {
                __m512 _sum0 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);

                _mm512_store_ps(outptr0, _sum0);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}